

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_compress.c
# Opt level: O3

int getbits(archive_read_filter *self,int n)

{
  long *plVar1;
  uint uVar2;
  long in_RAX;
  byte *pbVar3;
  int iVar4;
  long lVar5;
  ssize_t ret;
  long local_28;
  
  plVar1 = (long *)self->data;
  iVar4 = *(int *)((long)plVar1 + 0x1c);
  if (iVar4 < n) {
    lVar5 = plVar1[1];
    local_28 = in_RAX;
    do {
      if (lVar5 == 0) {
        if (plVar1[2] != 0) {
          __archive_read_filter_consume(self->upstream,plVar1[2]);
          plVar1[2] = 0;
        }
        pbVar3 = (byte *)__archive_read_filter_ahead(self->upstream,1,&local_28);
        *plVar1 = (long)pbVar3;
        if (local_28 == 0) {
          return -1;
        }
        if (local_28 < 0) {
          return -0x1e;
        }
        if (pbVar3 == (byte *)0x0) {
          return -0x1e;
        }
        plVar1[1] = local_28;
        plVar1[2] = local_28;
        iVar4 = *(int *)((long)plVar1 + 0x1c);
        lVar5 = local_28;
      }
      else {
        pbVar3 = (byte *)*plVar1;
      }
      *plVar1 = (long)(pbVar3 + 1);
      uVar2 = (uint)*pbVar3 << ((byte)iVar4 & 0x1f) | *(uint *)(plVar1 + 3);
      *(uint *)(plVar1 + 3) = uVar2;
      lVar5 = lVar5 + -1;
      plVar1[1] = lVar5;
      iVar4 = iVar4 + 8;
      *(int *)((long)plVar1 + 0x1c) = iVar4;
      plVar1[4] = plVar1[4] + 1;
    } while (iVar4 < n);
  }
  else {
    uVar2 = *(uint *)(plVar1 + 3);
  }
  *(int *)(plVar1 + 3) = (int)uVar2 >> ((byte)n & 0x1f);
  *(int *)((long)plVar1 + 0x1c) = iVar4 - n;
  return uVar2 & getbits::mask[n];
}

Assistant:

static int
getbits(struct archive_read_filter *self, int n)
{
	struct private_data *state = (struct private_data *)self->data;
	int code;
	ssize_t ret;
	static const int mask[] = {
		0x00, 0x01, 0x03, 0x07, 0x0f, 0x1f, 0x3f, 0x7f, 0xff,
		0x1ff, 0x3ff, 0x7ff, 0xfff, 0x1fff, 0x3fff, 0x7fff, 0xffff
	};

	while (state->bits_avail < n) {
		if (state->avail_in <= 0) {
			if (state->consume_unnotified) {
				__archive_read_filter_consume(self->upstream,
					state->consume_unnotified);
				state->consume_unnotified = 0;
			}
			state->next_in
			    = __archive_read_filter_ahead(self->upstream,
				1, &ret);
			if (ret == 0)
				return (-1);
			if (ret < 0 || state->next_in == NULL)
				return (ARCHIVE_FATAL);
			state->consume_unnotified = state->avail_in = ret;
		}
		state->bit_buffer |= *state->next_in++ << state->bits_avail;
		state->avail_in--;
		state->bits_avail += 8;
		state->bytes_in_section++;
	}

	code = state->bit_buffer;
	state->bit_buffer >>= n;
	state->bits_avail -= n;

	return (code & mask[n]);
}